

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

void __thiscall QGraphicsWidget::insertAction(QWindow *this,QAction *before,QAction *action)

{
  int iVar1;
  QGraphicsWidgetPrivate *t;
  qsizetype qVar2;
  QAction *in_RDX;
  QAction *in_RSI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  QActionPrivate *apriv;
  int pos;
  int index;
  QGraphicsWidgetPrivate *d;
  QActionEvent e;
  QListSpecialMethodsBase<QAction_*> *in_stack_ffffffffffffff80;
  QList<QAction_*> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  char local_38 [32];
  QAction *local_18;
  QAction *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  if (in_RDX == (QAction *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
               (char *)in_RDI);
    QMessageLogger::warning(local_38,"QWidget::insertAction: Attempt to insert null action");
  }
  else {
    local_18 = in_RDX;
    t = d_func((QGraphicsWidget *)0xa4eeb0);
    qVar2 = QListSpecialMethodsBase<QAction*>::indexOf<QAction*>
                      (in_stack_ffffffffffffff80,(QAction **)in_RDI,0xa4eecf);
    iVar1 = (int)qVar2;
    if (iVar1 != -1) {
      QList<QAction_*>::removeAt((QList<QAction_*> *)in_stack_ffffffffffffff80,(qsizetype)in_RDI);
    }
    qVar2 = QListSpecialMethodsBase<QAction*>::indexOf<QAction*>
                      (in_stack_ffffffffffffff80,(QAction **)in_RDI,0xa4ef0a);
    if ((int)qVar2 < 0) {
      local_10 = (QAction *)0x0;
      QList<QAction_*>::size(&t->actions);
    }
    QList<QAction_*>::insert
              (in_stack_ffffffffffffff88,(qsizetype)in_stack_ffffffffffffff80,(parameter_type)t);
    if (iVar1 == -1) {
      QAction::d_func((QAction *)0xa4ef64);
      QList<QObject_*>::append((QList<QObject_*> *)0xa4ef7e,in_RDI);
    }
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QActionEvent::QActionEvent((QActionEvent *)&local_58,0x72,local_18,local_10);
    QCoreApplication::sendEvent(in_RDI,(QEvent *)&local_58);
    QActionEvent::~QActionEvent((QActionEvent *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::insertAction(QAction *before, QAction *action)
{
    if (!action) {
        qWarning("QWidget::insertAction: Attempt to insert null action");
        return;
    }

    Q_D(QGraphicsWidget);
    int index = d->actions.indexOf(action);
    if (index != -1)
        d->actions.removeAt(index);

    int pos = d->actions.indexOf(before);
    if (pos < 0) {
        before = nullptr;
        pos = d->actions.size();
    }
    d->actions.insert(pos, action);

    if (index == -1) {
        QActionPrivate *apriv = action->d_func();
        apriv->associatedObjects.append(this);
    }

    QActionEvent e(QEvent::ActionAdded, action, before);
    QCoreApplication::sendEvent(this, &e);
}